

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

void tc_uECC_vli_modAdd(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
                       tc_uECC_word_t *mod,wordcount_t num_words)

{
  cmpresult_t cVar1;
  tc_uECC_word_t tVar2;
  
  tVar2 = tc_uECC_vli_add(result,left,right,num_words);
  if (tVar2 == 0) {
    cVar1 = tc_uECC_vli_cmp_unsafe(mod,result,num_words);
    if (cVar1 == '\x01') {
      return;
    }
  }
  tc_uECC_vli_sub(result,result,mod,num_words);
  return;
}

Assistant:

void tc_uECC_vli_modAdd(tc_uECC_word_t *result, const tc_uECC_word_t *left,
		     const tc_uECC_word_t *right, const tc_uECC_word_t *mod,
		     wordcount_t num_words)
{
	tc_uECC_word_t carry = tc_uECC_vli_add(result, left, right, num_words);
	if (carry || tc_uECC_vli_cmp_unsafe(mod, result, num_words) != 1) {
	/* result > mod (result = mod + remainder), so subtract mod to get
	 * remainder. */
		tc_uECC_vli_sub(result, result, mod, num_words);
	}
}